

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvwriter.cc
# Opt level: O0

bool __thiscall mkvmuxer::MkvWriter::Open(MkvWriter *this,char *filename)

{
  FILE *pFVar1;
  char *in_RSI;
  long in_RDI;
  bool local_1;
  
  if (in_RSI == (char *)0x0) {
    local_1 = false;
  }
  else if (*(long *)(in_RDI + 8) == 0) {
    pFVar1 = fopen64(in_RSI,"wb");
    *(FILE **)(in_RDI + 8) = pFVar1;
    if (*(long *)(in_RDI + 8) == 0) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool MkvWriter::Open(const char* filename) {
  if (filename == NULL)
    return false;

  if (file_)
    return false;

#ifdef _MSC_VER
  file_ = _fsopen(filename, "wb", _SH_DENYWR);
#else
  file_ = fopen(filename, "wb");
#endif
  if (file_ == NULL)
    return false;
  return true;
}